

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::SatdTest_MaxValue_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::SatdTest_MaxValue_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::SatdTestParam<int(*)(int_const*,int)>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x40);
  anon_unknown.dwarf_1f29eed::SatdTest::SatdTest((SatdTest *)this_00);
  (((SatdTestBase<int,_int_(*)(const_int_*,_int)> *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__SatdTestBase_0109c940;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SatdTest_MaxValue_Test_0109c980;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }